

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

void crnlib::MatchFinder_ReadBlock(CMatchFinder *p)

{
  UInt32 UVar1;
  SRes SVar2;
  UInt32 UVar3;
  size_t size;
  Byte *local_18;
  
  if (p->streamEndWasReached != 0) {
    return;
  }
  if (p->result == 0) {
    UVar1 = p->pos;
    UVar3 = p->streamPos;
    do {
      local_18 = p->bufferBase + ((ulong)p->blockSize - (long)(p->buffer + (UVar3 - UVar1)));
      if (local_18 == (Byte *)0x0) {
        return;
      }
      SVar2 = (*p->stream->Read)(p->stream,p->buffer + (UVar3 - UVar1),(size_t *)&local_18);
      p->result = SVar2;
      if (SVar2 != 0) {
        return;
      }
      if (local_18 == (Byte *)0x0) {
        p->streamEndWasReached = 1;
        return;
      }
      UVar3 = (int)local_18 + p->streamPos;
      p->streamPos = UVar3;
      UVar1 = p->pos;
    } while (UVar3 - UVar1 <= p->keepSizeAfter);
  }
  return;
}

Assistant:

static void MatchFinder_ReadBlock(CMatchFinder* p) {
  if (p->streamEndWasReached || p->result != SZ_OK)
    return;
  for (;;) {
    Byte* dest = p->buffer + (p->streamPos - p->pos);
    size_t size = (p->bufferBase + p->blockSize - dest);
    if (size == 0)
      return;
    p->result = p->stream->Read(p->stream, dest, &size);
    if (p->result != SZ_OK)
      return;
    if (size == 0) {
      p->streamEndWasReached = 1;
      return;
    }
    p->streamPos += (UInt32)size;
    if (p->streamPos - p->pos > p->keepSizeAfter)
      return;
  }
}